

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::getPixel
          (PtexReader *this,int faceid,int u,int v,float *result,int firstchan,int nchannelsArg,
          Res res)

{
  _func_int *p_Var1;
  long lVar2;
  PtexPtr<Ptex::v2_2::PtexFaceData> *this_00;
  PtexReader *pPVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  DataType dt;
  undefined4 extraout_var;
  PtexFaceData *pPVar7;
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  undefined8 local_90;
  undefined1 *local_88;
  DataType local_80;
  DataType local_7c;
  int local_78;
  DataType local_74;
  PtexPtr<Ptex::v2_2::PtexFaceData> *local_70;
  PtexFaceData *local_68;
  PtexReader *local_60;
  int local_58;
  int datasize;
  undefined1 *local_48;
  void *pixel;
  PtexPtr<Ptex::v2_2::PtexFaceData> local_38;
  PtexPtr<Ptex::v2_2::PtexFaceData> data;
  int firstchan_local;
  float *result_local;
  int v_local;
  int u_local;
  int faceid_local;
  PtexReader *this_local;
  
  uStack_a0 = 0x137bde;
  local_60 = this;
  data._ptr._4_4_ = firstchan;
  memset(result,0,(long)nchannelsArg);
  uStack_a0 = 0x137bf4;
  iVar5 = PtexUtils::min<int>(nchannelsArg,(uint)(local_60->_header).nchannels - data._ptr._4_4_);
  if (0 < iVar5) {
    pixel._6_2_ = res;
    uStack_a0 = 0x137c21;
    iVar6 = (*(local_60->super_PtexTexture)._vptr_PtexTexture[0x14])
                      (local_60,(ulong)(uint)faceid,(ulong)(ushort)res);
    local_70 = &local_38;
    uStack_a0 = 0x137c31;
    PtexPtr<Ptex::v2_2::PtexFaceData>::PtexPtr
              (local_70,(PtexFaceData *)CONCAT44(extraout_var,iVar6));
    this_00 = local_70;
    lVar2 = -((long)local_60->_pixelsize + 0xfU & 0xfffffffffffffff0);
    local_48 = auStack_98 + lVar2;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137c5a;
    pPVar7 = PtexPtr<Ptex::v2_2::PtexFaceData>::operator->(this_00);
    puVar4 = local_48;
    p_Var1 = pPVar7->_vptr_PtexFaceData[5];
    local_68 = pPVar7;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137c77;
    (*p_Var1)(pPVar7,(ulong)(uint)u,(ulong)(uint)v,puVar4);
    pPVar3 = local_60;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137c82;
    dt = datatype(pPVar3);
    local_74 = dt;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137c8f;
    local_78 = DataSize(dt);
    pPVar3 = local_60;
    if (data._ptr._4_4_ != 0) {
      local_48 = local_48 + local_78 * data._ptr._4_4_;
    }
    local_58 = local_78;
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137cd7;
    local_7c = datatype(pPVar3);
    puVar4 = local_48;
    pPVar3 = local_60;
    if (local_7c == dt_float) {
      iVar5 = local_58 * iVar5;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137cfb;
      memcpy(result,puVar4,(long)iVar5);
    }
    else {
      local_88 = local_48;
      local_90 = result;
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137d19;
      local_80 = datatype(pPVar3);
      *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137d34;
      ConvertToFloat(*(float **)((long)&local_80 + lVar2),*(void **)((long)&local_88 + lVar2),
                     *(DataType *)((long)&local_90 + lVar2 + 4),*(int *)((long)&local_90 + lVar2));
    }
    *(undefined8 *)(auStack_98 + lVar2 + -8) = 0x137d41;
    PtexPtr<Ptex::v2_2::PtexFaceData>::~PtexPtr
              (*(PtexPtr<Ptex::v2_2::PtexFaceData> **)((long)&local_90 + lVar2));
  }
  return;
}

Assistant:

void PtexReader::getPixel(int faceid, int u, int v,
                          float* result, int firstchan, int nchannelsArg,
                          Ptex::Res res)
{
    memset(result, 0, nchannelsArg);

    // clip nchannels against actual number available
    nchannelsArg = PtexUtils::min(nchannelsArg, _header.nchannels-firstchan);
    if (nchannelsArg <= 0) return;

    // get raw pixel data
    PtexPtr<PtexFaceData> data ( getData(faceid, res) );
    void* pixel = alloca(_pixelsize);
    data->getPixel(u, v, pixel);

    // adjust for firstchan offset
    int datasize = DataSize(datatype());
    if (firstchan)
        pixel = (char*) pixel + datasize * firstchan;

    // convert/copy to result as needed
    if (datatype() == dt_float)
        memcpy(result, pixel, datasize * nchannelsArg);
    else
        ConvertToFloat(result, pixel, datatype(), nchannelsArg);
}